

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_write_key_anchor(Parser *this,size_t node_id)

{
  pfn_error p_Var1;
  Tree *this_00;
  code *pcVar2;
  Location LVar3;
  csubstr ref;
  bool bVar4;
  int iVar5;
  NodeData *pNVar6;
  csubstr *pcVar7;
  size_t sVar8;
  csubstr cVar9;
  csubstr fmt;
  csubstr fmt_00;
  csubstr r;
  char *pcStack_68;
  size_t local_60;
  char msg [41];
  
  pNVar6 = Tree::_p(this->m_tree,node_id);
  if (((pNVar6->m_type).type & KEY) == NOTYPE) {
    builtin_strncpy(msg + 0x20,"ode_id))",9);
    builtin_strncpy(msg + 0x10,"_tree->has_key(n",0x10);
    builtin_strncpy(msg,"check failed: (m",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar9 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_60 = cVar9.len;
    pcStack_68 = cVar9.str;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x76e1) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x76e1) << 0x40,8);
    LVar3.name.str = pcStack_68;
    LVar3.name.len = local_60;
    (*p_Var1)(msg,0x29,LVar3,(this->m_stack).m_callbacks.m_user_data);
  }
  if ((this->m_key_anchor).str == (char *)0x0 || (this->m_key_anchor).len == 0) {
    pNVar6 = Tree::_p(this->m_tree,node_id);
    if ((~(int)(pNVar6->m_type).type & 0x2002U) != 0) {
      pcVar7 = Tree::key(this->m_tree,node_id);
      r.str = pcVar7->str;
      sVar8 = pcVar7->len;
      r.len = sVar8;
      if ((sVar8 == 0) || (*r.str != '*')) {
        iVar5 = basic_substring<const_char>::compare(&r,"<<",2);
        if (iVar5 == 0) {
          cVar9.len = sVar8;
          cVar9.str = r.str;
          Tree::set_key_ref(this->m_tree,node_id,cVar9);
          pNVar6 = Tree::_p(this->m_tree,node_id);
          if (((pNVar6->m_type).type & SEQ) == NOTYPE) {
            pcVar7 = Tree::val(this->m_tree,node_id);
            if ((pcVar7->len == 0) || (*pcVar7->str != '*')) {
              bVar4 = is_debugger_attached();
              if (bVar4) {
                bVar4 = is_debugger_attached();
                if (bVar4) {
                  pcVar2 = (code *)swi(3);
                  (*pcVar2)();
                  return;
                }
              }
              pcVar7 = Tree::val(this->m_tree,node_id);
              fmt.len = 0x20;
              fmt.str = "ERROR: malformed reference: \'{}\'";
              _err<c4::basic_substring<char_const>>(this,fmt,pcVar7);
            }
          }
          else {
            for (sVar8 = Tree::first_child(this->m_tree,node_id); sVar8 != 0xffffffffffffffff;
                sVar8 = Tree::next_sibling(this->m_tree,sVar8)) {
              pcVar7 = Tree::val(this->m_tree,sVar8);
              if ((pcVar7->len == 0) || (*pcVar7->str != '*')) {
                bVar4 = is_debugger_attached();
                if (bVar4) {
                  bVar4 = is_debugger_attached();
                  if (bVar4) {
                    pcVar2 = (code *)swi(3);
                    (*pcVar2)();
                    return;
                  }
                }
                pcVar7 = Tree::val(this->m_tree,sVar8);
                fmt_00.len = 0x20;
                fmt_00.str = "ERROR: malformed reference: \'{}\'";
                _err<c4::basic_substring<char_const>>(this,fmt_00,pcVar7);
              }
            }
          }
        }
      }
      else {
        this_00 = this->m_tree;
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)msg,r.str + 1,sVar8 - 1);
        ref.len._0_1_ = msg[8];
        ref.len._1_1_ = msg[9];
        ref.len._2_1_ = msg[10];
        ref.len._3_1_ = msg[0xb];
        ref.len._4_1_ = msg[0xc];
        ref.len._5_1_ = msg[0xd];
        ref.len._6_1_ = msg[0xe];
        ref.len._7_1_ = msg[0xf];
        ref.str = (char *)msg._0_8_;
        Tree::set_key_ref(this_00,node_id,ref);
      }
    }
  }
  else {
    Tree::set_key_anchor(this->m_tree,node_id,this->m_key_anchor);
    this->m_key_anchor_was_before = false;
    this->m_key_anchor_indentation = 0;
    (this->m_key_anchor).str = (char *)0x0;
    (this->m_key_anchor).len = 0;
  }
  return;
}

Assistant:

void Parser::_write_key_anchor(size_t node_id)
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->has_key(node_id));
    if( ! m_key_anchor.empty())
    {
        _c4dbgpf("node={}: set key anchor to '{}'", node_id, m_key_anchor);
        m_tree->set_key_anchor(node_id, m_key_anchor);
        m_key_anchor.clear();
        m_key_anchor_was_before = false;
        m_key_anchor_indentation = 0;
    }
    else if( ! m_tree->is_key_quoted(node_id))
    {
        csubstr r = m_tree->key(node_id);
        if(r.begins_with('*'))
        {
            _c4dbgpf("node={}: set key reference: '{}'", node_id, r);
            m_tree->set_key_ref(node_id, r.sub(1));
        }
        else if(r == "<<")
        {
            m_tree->set_key_ref(node_id, r);
            _c4dbgpf("node={}: it's an inheriting reference", node_id);
            if(m_tree->is_seq(node_id))
            {
                _c4dbgpf("node={}: inheriting from seq of {}", node_id, m_tree->num_children(node_id));
                for(size_t i = m_tree->first_child(node_id); i != NONE; i = m_tree->next_sibling(i))
                {
                    if( ! (m_tree->val(i).begins_with('*')))
                        _c4err("malformed reference: '{}'", m_tree->val(i));
                }
            }
            else if( ! m_tree->val(node_id).begins_with('*'))
            {
                 _c4err("malformed reference: '{}'", m_tree->val(node_id));
            }
            //m_tree->set_key_ref(node_id, r);
        }
    }
}